

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall
JsrtDebugManager::ReportBreak(JsrtDebugManager *this,InterpreterHaltState *haltState)

{
  Utf8SourceInfo *this_00;
  ScriptContext *scriptContext;
  ProbeList *pPVar1;
  BreakpointProbe *this_01;
  code *pcVar2;
  bool bVar3;
  int byteOffset;
  JsDiagDebugEvent debugEvent;
  FunctionBody *_pBody;
  undefined4 *puVar4;
  DynamicObject *object;
  DebugContext *pDVar5;
  DebugDocument *debugDocument;
  UINT value;
  JsrtDebugManager *this_02;
  int i;
  long lVar6;
  BreakpointProbe *bp;
  undefined1 local_68 [8];
  JsrtDebugEventObject debugEventObject;
  
  if (this->debugEventCallback != (JsDiagDebugEventCallback)0x0) {
    _pBody = Js::InterpreterHaltState::GetFunction(haltState);
    if (_pBody == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                         ,0x100,"(functionBody != nullptr)","functionBody != nullptr");
      if (!bVar3) goto LAB_003952a3;
      *puVar4 = 0;
    }
    this_00 = (_pBody->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
    this_02 = (JsrtDebugManager *)haltState;
    byteOffset = Js::InterpreterHaltState::GetCurrentOffset(haltState);
    scriptContext = (this_00->m_scriptContext).ptr;
    debugEvent = GetDebugEventFromStopType(this_02,haltState->stopType);
    JsrtDebugEventObject::JsrtDebugEventObject((JsrtDebugEventObject *)local_68,scriptContext);
    object = JsrtDebugEventObject::GetEventDataObject((JsrtDebugEventObject *)local_68);
    pDVar5 = Js::ScriptContext::GetDebugContext(scriptContext);
    if (debugEvent == JsDiagDebugEventBreakpoint) {
      pPVar1 = pDVar5->diagProbesContainer->diagProbeList;
      lVar6 = 0;
      debugEventObject.scriptContext = (ScriptContext *)this;
      do {
        if ((pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>).count
            <= lVar6) goto LAB_003951e6;
        this_01 = (BreakpointProbe *)
                  (pPVar1->super_ReadOnlyList<Js::Probe_*,_Memory::ArenaAllocator,_DefaultComparer>)
                  .buffer[lVar6];
        debugDocument = Js::Utf8SourceInfo::GetDebugDocument(this_00);
        bVar3 = Js::BreakpointProbe::Matches(this_01,_pBody,debugDocument,byteOffset);
        lVar6 = lVar6 + 1;
      } while (!bVar3);
      value = this_01->breakpointId;
      if (value == 0) {
LAB_003951e6:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                           ,0x11c,"(bpId != 0)",
                           "How come we don\'t have a breakpoint id for JsDiagDebugEventBreakpoint")
        ;
        if (!bVar3) {
LAB_003952a3:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
        value = 0;
      }
      JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0x1,value,scriptContext);
      this = (JsrtDebugManager *)debugEventObject.scriptContext;
    }
    JsrtDebugUtils::AddScriptIdToObject(object,this_00);
    JsrtDebugUtils::AddLineColumnToObject(object,_pBody,byteOffset);
    JsrtDebugUtils::AddSourceLengthAndTextToObject(object,_pBody,byteOffset);
    CallDebugEventCallbackForBreak(this,debugEvent,object,scriptContext);
    JsrtDebugEventObject::~JsrtDebugEventObject((JsrtDebugEventObject *)local_68);
  }
  return;
}

Assistant:

void JsrtDebugManager::ReportBreak(Js::InterpreterHaltState* haltState)
{
    if (this->debugEventCallback != nullptr)
    {
        Js::FunctionBody* functionBody = haltState->GetFunction();
        Assert(functionBody != nullptr);

        Js::Utf8SourceInfo* utf8SourceInfo = functionBody->GetUtf8SourceInfo();
        int currentByteCodeOffset = haltState->GetCurrentOffset();
        Js::ScriptContext* scriptContext = utf8SourceInfo->GetScriptContext();

        JsDiagDebugEvent jsDiagDebugEvent = this->GetDebugEventFromStopType(haltState->stopType);

        JsrtDebugEventObject debugEventObject(scriptContext);

        Js::DynamicObject* eventDataObject = debugEventObject.GetEventDataObject();

        Js::ProbeContainer* probeContainer = scriptContext->GetDebugContext()->GetProbeContainer();

        if (jsDiagDebugEvent == JsDiagDebugEventBreakpoint)
        {
            UINT bpId = 0;
            probeContainer->MapProbesUntil([&](int i, Js::Probe* pProbe)
            {
                Js::BreakpointProbe* bp = (Js::BreakpointProbe*)pProbe;
                if (bp->Matches(functionBody, utf8SourceInfo->GetDebugDocument(), currentByteCodeOffset))
                {
                    bpId = bp->GetId();
                    return true;
                }
                return false;
            });

            AssertMsg(bpId != 0, "How come we don't have a breakpoint id for JsDiagDebugEventBreakpoint");

            JsrtDebugUtils::AddPropertyToObject(eventDataObject, JsrtDebugPropertyId::breakpointId, bpId, scriptContext);
        }

        JsrtDebugUtils::AddScriptIdToObject(eventDataObject, utf8SourceInfo);
        JsrtDebugUtils::AddLineColumnToObject(eventDataObject, functionBody, currentByteCodeOffset);
        JsrtDebugUtils::AddSourceLengthAndTextToObject(eventDataObject, functionBody, currentByteCodeOffset);

        this->CallDebugEventCallbackForBreak(jsDiagDebugEvent, eventDataObject, scriptContext);
    }
}